

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::getChunkInfo
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *names,vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *png)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  uint length;
  char type [5];
  uchar *next;
  uchar *end;
  uchar *begin;
  uchar *chunk;
  value_type *in_stack_ffffffffffffff18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  allocator<char> local_69;
  string local_68 [35];
  char local_45 [5];
  uchar *local_40;
  const_reference local_38;
  const_reference local_30;
  uchar *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_10 = in_RDI;
  local_38 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                       (in_stack_ffffffffffffff20);
  local_38 = local_38 + 1;
  local_30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                       (in_stack_ffffffffffffff20);
  local_30 = local_30 + 8;
  local_28 = local_30;
  do {
    if (local_38 <= local_28 + 8 || local_28 < local_30) {
      return 0;
    }
    lodepng_chunk_type(local_45,local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    lVar3 = std::__cxx11::string::size();
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    if (lVar3 != 4) {
      return 1;
    }
    uVar2 = lodepng_chunk_length((uchar *)0x13e0b9);
    this = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this,in_stack_ffffffffffffff18);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
    in_stack_ffffffffffffff50 = (allocator<char> *)(ulong)uVar2;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,
               (value_type_conflict2 *)in_stack_ffffffffffffff18);
    if (local_38 < local_28 + (ulong)uVar2 + 0xc) {
      return 1;
    }
    local_40 = lodepng_chunk_next_const((uchar *)in_stack_ffffffffffffff18);
    bVar1 = local_28 < local_40;
    local_28 = local_40;
  } while (bVar1);
  return 1;
}

Assistant:

unsigned getChunkInfo(std::vector<std::string>& names, std::vector<size_t>& sizes,
                      const std::vector<unsigned char>& png) {
  // Listing chunks is based on the original file, not the decoded png info.
  const unsigned char *chunk, *begin, *end, *next;
  end = &png.back() + 1;
  begin = chunk = &png.front() + 8;

  while(chunk + 8 < end && chunk >= begin) {
    char type[5];
    lodepng_chunk_type(type, chunk);
    if(std::string(type).size() != 4) return 1;

    unsigned length = lodepng_chunk_length(chunk);
    names.push_back(type);
    sizes.push_back(length);
    if(chunk + length + 12 > end) return 1;

    next = lodepng_chunk_next_const(chunk);
    if (next <= chunk) return 1; // integer overflow
    chunk = next;
  }
  return 0;
}